

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilerBuffer.cpp
# Opt level: O0

void __thiscall
helics::ProfilerBuffer::setOutputFile(ProfilerBuffer *this,string *fileName,bool append)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  int *piVar4;
  error_code *this_00;
  byte in_DL;
  int in_EDI;
  ofstream file;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  string local_218 [519];
  byte local_11;
  
  local_11 = in_DL & 1;
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6854f1);
  if (bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x685505);
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    if ((local_11 & 1) == 0) {
      std::ofstream::ofstream(local_218);
      std::operator|(_S_out,_S_trunc);
      std::ofstream::open(local_218,in_EDI + (_S_out|_S_in));
      bVar2 = std::ios::fail();
      if ((bVar2 & 1) != 0) {
        pcVar3 = (char *)__cxa_allocate_exception(0x20);
        pcVar5 = pcVar3;
        piVar4 = __errno_location();
        this_00 = (error_code *)strerror(*piVar4);
        std::error_code::error_code<std::io_errc,void>(this_00,(io_errc)((ulong)pcVar5 >> 0x20));
        std::ios_base::failure[abi:cxx11]::failure(pcVar5,this_00);
        __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      std::ofstream::~ofstream(local_218);
    }
  }
  return;
}

Assistant:

void ProfilerBuffer::setOutputFile(std::string fileName, bool append)
{
    if (fileName.empty()) {
        mFileName.clear();
        return;
    }
    mFileName = std::move(fileName);
    if (append) {
        return;
    }

    std::ofstream file;
    // can't enable exception now because of gcc bug that raises ios_base::failure with useless
    // message file.exceptions(file.exceptions() | std::ios::failbit);
    file.open(mFileName, std::ios::out | std::ios::trunc);
    if (file.fail()) {
        throw std::ios_base::failure(std::strerror(errno));
    }
}